

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::CheckpointScan
          (ColumnData *this,ColumnSegment *segment,ColumnScanState *state,idx_t row_group_start,
          idx_t count,Vector *scan_vector)

{
  TableScanOptions *pTVar1;
  pointer this_00;
  idx_t iVar2;
  ColumnFetchState fetch_state;
  ColumnFetchState local_80;
  
  if ((state->scan_options).ptr != (TableScanOptions *)0x0) {
    pTVar1 = optional_ptr<duckdb::TableScanOptions,_true>::operator->(&state->scan_options);
    if (pTVar1->force_fetch_row == true) {
      for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
        local_80.handles._M_h._M_bucket_count = 1;
        local_80.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_80.handles._M_h._M_element_count = 0;
        local_80.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_80.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.handles._M_h._M_rehash_policy._M_next_resize = 0;
        local_80.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_80.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_80.handles._M_h._M_buckets = &local_80.handles._M_h._M_single_bucket;
        (*((segment->function)._M_data)->fetch_row)
                  (segment,&local_80,
                   (state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start) +
                   iVar2,scan_vector,iVar2);
        ColumnFetchState::~ColumnFetchState(&local_80);
      }
      goto LAB_0154906f;
    }
  }
  (*((segment->function)._M_data)->scan_partial)(segment,state,count,scan_vector,0);
LAB_0154906f:
  if ((this->updates).
      super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
      super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl != (UpdateSegment *)0x0) {
    this_00 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
              operator->(&this->updates);
    UpdateSegment::FetchCommittedRange(this_00,state->row_index - row_group_start,count,scan_vector)
    ;
  }
  return;
}

Assistant:

void ColumnData::CheckpointScan(ColumnSegment &segment, ColumnScanState &state, idx_t row_group_start, idx_t count,
                                Vector &scan_vector) {
	if (state.scan_options && state.scan_options->force_fetch_row) {
		for (idx_t i = 0; i < count; i++) {
			ColumnFetchState fetch_state;
			segment.FetchRow(fetch_state, UnsafeNumericCast<row_t>(state.row_index + i), scan_vector, i);
		}
	} else {
		segment.Scan(state, count, scan_vector, 0, ScanVectorType::SCAN_FLAT_VECTOR);
	}

	if (updates) {
		D_ASSERT(scan_vector.GetVectorType() == VectorType::FLAT_VECTOR);
		updates->FetchCommittedRange(state.row_index - row_group_start, count, scan_vector);
	}
}